

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte bVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  byte *pbVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  double dVar22;
  
  *pResult = 0.0;
  if (length == 0) {
    return 0;
  }
  if (enc == '\x01') {
    lVar20 = 1;
    iVar13 = 1;
    pbVar16 = (byte *)z;
  }
  else {
    uVar8 = 3 - enc;
    uVar7 = (ulong)uVar8;
    iVar13 = 1;
    if ((int)uVar8 < (int)(length & 0xfffffffeU)) {
      uVar7 = (ulong)(int)(3 - (uint)enc);
      do {
        if (z[uVar7] != '\0') {
          iVar13 = -100;
          goto LAB_0015571b;
        }
        uVar7 = uVar7 + 2;
      } while ((long)uVar7 < (long)(int)(length & 0xfffffffeU));
      iVar13 = 1;
    }
LAB_0015571b:
    length = (uint)uVar7 ^ 1;
    pbVar16 = (byte *)(z + (enc & 1));
    lVar20 = 2;
  }
  pbVar12 = (byte *)(z + length);
  bVar21 = pbVar16 < pbVar12;
  if (!bVar21) {
    return 0;
  }
  bVar1 = *pbVar16;
  while ((""[bVar1] & 1) != 0) {
    pbVar16 = pbVar16 + lVar20;
    bVar21 = pbVar16 < pbVar12;
    if (!bVar21) {
      return 0;
    }
    bVar1 = *pbVar16;
  }
  if (!bVar21) {
    return 0;
  }
  bVar1 = *pbVar16;
  lVar9 = 0;
  lVar14 = 0;
  if ((bVar1 - 0x2b & 0xfd) == 0) {
    lVar14 = lVar20;
  }
  pbVar16 = pbVar16 + lVar14;
  iVar6 = 1;
  bVar21 = pbVar16 < pbVar12;
  if (bVar21) {
    uVar7 = (ulong)*pbVar16;
    if (uVar7 - 0x3a < 0xfffffffffffffff6) {
      iVar15 = 0;
      iVar10 = 0;
      lVar9 = 0;
    }
    else {
      lVar9 = 0;
      iVar10 = 0;
      iVar15 = 0;
      do {
        lVar9 = (long)(char)uVar7 + lVar9 * 10 + -0x30;
        pbVar16 = pbVar16 + lVar20;
        if (0xcccccccccccccca < lVar9) {
          for (; (pbVar16 < pbVar12 && (0xfffffffffffffff5 < (ulong)*pbVar16 - 0x3a));
              pbVar16 = pbVar16 + lVar20) {
            iVar10 = iVar10 + 1;
          }
        }
        iVar15 = iVar15 + 1;
        bVar21 = pbVar16 < pbVar12;
        if (!bVar21) goto LAB_001558d1;
        uVar7 = (ulong)*pbVar16;
      } while (0xfffffffffffffff5 < uVar7 - 0x3a);
    }
    if (bVar21) {
      if (*pbVar16 == 0x2e) {
        iVar13 = iVar13 + 1;
        while ((pbVar16 = pbVar16 + lVar20, pbVar16 < pbVar12 &&
               (0xfffffffffffffff5 < (ulong)*pbVar16 - 0x3a))) {
          if (lVar9 < 0xccccccccccccccb) {
            lVar9 = (long)(char)*pbVar16 + lVar9 * 10 + -0x30;
            iVar10 = iVar10 + -1;
            iVar15 = iVar15 + 1;
          }
        }
      }
      if (pbVar16 < pbVar12) {
        if ((*pbVar16 | 0x20) == 0x65) {
          pbVar16 = pbVar16 + lVar20;
          iVar13 = iVar13 + 1;
          if (pbVar12 <= pbVar16) {
            iVar19 = 0;
            iVar6 = 1;
            bVar21 = false;
            goto LAB_001558d6;
          }
          iVar6 = 1;
          if (*pbVar16 == 0x2b) {
            pbVar16 = pbVar16 + lVar20;
          }
          else if (*pbVar16 == 0x2d) {
            pbVar16 = pbVar16 + lVar20;
            iVar6 = -1;
          }
          iVar19 = 0;
          if (pbVar16 < pbVar12) {
            uVar7 = (ulong)*pbVar16;
            if (uVar7 - 0x3a < 0xfffffffffffffff6) {
              bVar21 = false;
            }
            else {
              bVar21 = true;
              iVar18 = 0;
              do {
                pbVar16 = pbVar16 + lVar20;
                iVar19 = (char)uVar7 + -0x30 + iVar18 * 10;
                if (9999 < iVar18) {
                  iVar19 = 10000;
                }
              } while ((pbVar16 < pbVar12) &&
                      (uVar7 = (ulong)*pbVar16, iVar18 = iVar19, 0xfffffffffffffff5 < uVar7 - 0x3a))
              ;
            }
          }
          else {
            bVar21 = false;
          }
        }
        else {
          iVar19 = 0;
          iVar6 = 1;
          bVar21 = true;
        }
        while ((pbVar16 < pbVar12 && ((""[*pbVar16] & 1) != 0))) {
          pbVar16 = pbVar16 + lVar20;
        }
        goto LAB_001558d6;
      }
    }
LAB_001558d1:
    iVar19 = 0;
    bVar21 = true;
  }
  else {
    iVar10 = 0;
    iVar19 = 0;
    bVar21 = true;
    iVar15 = 0;
  }
LAB_001558d6:
  if (lVar9 == 0) {
    if (bVar1 == 0x2d) {
      dVar22 = -0.0;
    }
    else {
      dVar22 = 0.0;
    }
  }
  else {
    uVar17 = iVar19 * iVar6 + iVar10;
    uVar8 = -uVar17;
    if (0 < (int)uVar17) {
      uVar8 = uVar17;
    }
    uVar11 = uVar8;
    if (uVar17 != 0) {
      do {
        uVar11 = uVar8;
        if ((int)uVar17 < 0) {
          uVar7 = lVar9 * -0x3333333333333333 + 0x1999999999999998;
          if (0x1999999999999998 < (uVar7 >> 1 | (ulong)((uVar7 & 1) != 0) << 0x3f)) break;
          lVar9 = lVar9 / 10;
        }
        else {
          if (0xccccccccccccccb < lVar9) break;
          lVar9 = lVar9 * 10;
        }
        uVar11 = uVar8 - 1;
        bVar2 = 1 < (int)uVar8;
        uVar8 = uVar11;
      } while (bVar2);
    }
    lVar20 = -lVar9;
    if (bVar1 != 0x2d) {
      lVar20 = lVar9;
    }
    if (uVar11 == 0) {
      dVar22 = (double)lVar20;
    }
    else if ((int)uVar11 < 0x134) {
      fVar4 = 10.0;
      if ((uVar11 & 1) == 0) {
        fVar4 = 1.0;
      }
      if (uVar11 != 1) {
        fVar3 = 10.0;
        fVar5 = fVar4;
        do {
          uVar8 = (int)uVar11 >> 1;
          fVar3 = fVar3 * fVar3;
          fVar4 = fVar5 * fVar3;
          if ((uVar11 & 2) == 0) {
            fVar4 = fVar5;
          }
          uVar11 = uVar8;
          fVar5 = fVar4;
        } while (1 < uVar8);
      }
      if ((int)uVar17 < 0) {
        fVar4 = (float)lVar20 / fVar4;
      }
      else {
        fVar4 = (float)lVar20 * fVar4;
      }
      dVar22 = (double)fVar4;
    }
    else if ((int)uVar11 < 0x156) {
      fVar4 = 10.0;
      if ((uVar11 & 1) == 0) {
        fVar4 = 1.0;
      }
      if (1 < uVar11 - 0x134) {
        fVar3 = 10.0;
        fVar5 = fVar4;
        uVar8 = uVar11 - 0x134;
        do {
          uVar11 = (int)uVar8 >> 1;
          fVar3 = fVar3 * fVar3;
          fVar4 = fVar5 * fVar3;
          if ((uVar8 & 2) == 0) {
            fVar4 = fVar5;
          }
          fVar5 = fVar4;
          uVar8 = uVar11;
        } while (1 < uVar11);
      }
      if ((int)uVar17 < 0) {
        dVar22 = (double)((float)lVar20 / fVar4) / 1e+308;
      }
      else {
        dVar22 = (double)((float)lVar20 * fVar4) * 1e+308;
      }
    }
    else if ((int)uVar17 < 0) {
      dVar22 = (double)((ulong)(double)lVar20 & 0x8000000000000000);
    }
    else {
      dVar22 = (double)((float)lVar20 * INFINITY);
    }
  }
  *pResult = dVar22;
  if ((!(bool)((0 < iVar15 && pbVar16 == pbVar12) & bVar21 & 0 < iVar13)) &&
     (((iVar13 < 2 || (!bVar21 && iVar13 != 3)) || (iVar13 = -1, iVar15 < 1)))) {
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */
  if( length==0 ) return 0;

  if( enc==SQLITE_UTF8 ){
    incr = 1;
    zEnd = z + length;
  }else{
    int i;
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_INT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_INT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  if( s==0 ) {
    /* In the IEEE 754 standard, zero is signed. */
    result = sign<0 ? -(double)0 : (double)0;
  } else {
    /* Attempt to reduce exponent.
    **
    ** Branches that are not required for the correct answer but which only
    ** help to obtain the correct answer faster are marked with special
    ** comments, as a hint to the mutation tester.
    */
    while( e>0 ){                                       /*OPTIMIZATION-IF-TRUE*/
      if( esign>0 ){
        if( s>=(LARGEST_INT64/10) ) break;             /*OPTIMIZATION-IF-FALSE*/
        s *= 10;
      }else{
        if( s%10!=0 ) break;                           /*OPTIMIZATION-IF-FALSE*/
        s /= 10;
      }
      e--;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    if( e==0 ){                                         /*OPTIMIZATION-IF-TRUE*/
      result = (double)s;
    }else{
      /* attempt to handle extremely small/large numbers better */
      if( e>307 ){                                      /*OPTIMIZATION-IF-TRUE*/
        if( e<342 ){                                    /*OPTIMIZATION-IF-TRUE*/
          LONGDOUBLE_TYPE scale = sqlite3Pow10(e-308);
          if( esign<0 ){
            result = s / scale;
            result /= 1.0e+308;
          }else{
            result = s * scale;
            result *= 1.0e+308;
          }
        }else{ assert( e>=342 );
          if( esign<0 ){
            result = 0.0*s;
          }else{
#ifdef INFINITY
            result = INFINITY*s;
#else
            result = 1e308*1e308*s;  /* Infinity */
#endif
          }
        }
      }else{
        LONGDOUBLE_TYPE scale = sqlite3Pow10(e);
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}